

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derTOCTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  size_t sVar1;
  size_t sVar2;
  size_t l;
  u32 t;
  size_t local_38;
  u32 local_2c;
  
  sVar1 = derTLDec(&local_2c,&local_38,der,count);
  if (sVar1 == 0xffffffffffffffff) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    der = der + sVar1;
    sVar2 = 0xffffffffffffffff;
    if (local_38 + sVar1 <= count) {
      sVar2 = local_38 + sVar1;
    }
  }
  sVar1 = 0xffffffffffffffff;
  if (local_2c == tag && sVar2 != 0xffffffffffffffff) {
    if (val != (octet *)0x0) {
      memMove(val,der,local_38);
    }
    sVar1 = sVar2;
    if (len != (size_t *)0x0) {
      *len = local_38;
    }
  }
  return sVar1;
}

Assistant:

size_t derTOCTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
	{
		ASSERT(memIsValid(val, l));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l));
		memMove(val, v, l);
	}
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}